

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_maddld(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_op3_ppc64(s,INDEX_op_mul_i64,(TCGArg)ts,
                    (long)&s->pool_cur +
                    *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
                    (long)&s->pool_cur + *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8))
                   );
  tcg_gen_op3_ppc64(s,INDEX_op_add_i64,
                    (long)&s->pool_cur +
                    *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(TCGArg)ts,
                    (long)&s->pool_cur + *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 3 & 0xf8))
                   );
  tcg_temp_free_internal_ppc64(s,ts);
  return;
}

Assistant:

static void gen_maddld(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_mul_i64(tcg_ctx, t1, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_add_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t1, cpu_gpr[rC(ctx->opcode)]);
    tcg_temp_free_i64(tcg_ctx, t1);
}